

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O2

string * __thiscall
anon_unknown.dwarf_3c73d5::cmEnumPathSegmentsGenerator::GetNextCandidate
          (string *__return_storage_ptr__,cmEnumPathSegmentsGenerator *this,string *parent)

{
  basic_string_view<char,_std::char_traits<char>_> *args;
  cmAlphaNum local_68;
  cmAlphaNum local_38;
  
  args = (this->Current)._M_current;
  if (args == (((this->Names)._M_data)->
              super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    local_38.View_._M_str = (parent->_M_dataplus)._M_p;
    local_38.View_._M_len = parent->_M_string_length;
    local_68.View_._M_str = local_68.Digits_;
    local_68.View_._M_len = 1;
    local_68.Digits_[0] = '/';
    (this->Current)._M_current = args + 1;
    cmStrCat<std::basic_string_view<char,std::char_traits<char>>>
              (__return_storage_ptr__,&local_38,&local_68,args);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetNextCandidate(const std::string& parent)
  {
    if (this->Current != this->Names.get().cend()) {
      return cmStrCat(parent, '/', *this->Current++);
    }
    return {};
  }